

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

bool __thiscall CppUnit::Test::findTestPath(Test *this,Test *test,TestPath *testPath)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  ulong uVar6;
  
  if (this == test) {
    (*testPath->_vptr_TestPath[3])(testPath,this);
LAB_001293f3:
    bVar2 = true;
  }
  else {
    uVar3 = (*this->_vptr_Test[4])(this);
    bVar2 = 0 < (int)uVar3;
    if (0 < (int)uVar3) {
      uVar6 = 0;
      do {
        iVar4 = (*this->_vptr_Test[5])(this,uVar6);
        cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x40))
                          ((long *)CONCAT44(extraout_var,iVar4),test,testPath);
        if (cVar1 != '\0') {
          (*testPath->_vptr_TestPath[5])(testPath,this,0);
          goto LAB_001293f3;
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
      } while (uVar3 != uVar5);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool 
Test::findTestPath( const Test *test,
                    TestPath &testPath ) const
{
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  if ( this == test )
  {
    testPath.add( mutableThis );
    return true;
  }

  int childCount = getChildTestCount();
  for ( int childIndex =0; childIndex < childCount; ++childIndex )
  {
    if ( getChildTestAt( childIndex )->findTestPath( test, testPath ) )
    {
      testPath.insert( mutableThis, 0 );
      return true;
    }
  }

  return false;
}